

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<unsigned_int>::ImmediatePromiseNode
          (ImmediatePromiseNode<unsigned_int> *this,ExceptionOr<unsigned_int> *result)

{
  bool bVar1;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_006482e8;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&this->result,(Maybe<kj::Exception> *)result);
  bVar1 = (result->value).ptr.isSet;
  (this->result).value.ptr.isSet = bVar1;
  if (bVar1 == true) {
    (this->result).value.ptr.field_1 = (result->value).ptr.field_1;
  }
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}